

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::D3MFImporter::CanRead
          (D3MFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  D3MFOpcPackage opcPackage;
  string extension;
  D3MFOpcPackage DStack_58;
  string local_48;
  
  BaseImporter::GetExtension(&local_48,filename);
  bVar1 = std::operator==(&local_48,"3mf");
  bVar2 = true;
  if (!bVar1) {
    bVar2 = false;
    if ((pIOHandler != (IOSystem *)0x0) && (local_48._M_string_length == 0 || checkSig)) {
      bVar1 = ZipArchiveIOSystem::isZipArchive(pIOHandler,filename);
      if (bVar1) {
        D3MF::D3MFOpcPackage::D3MFOpcPackage(&DStack_58,pIOHandler,filename);
        bVar2 = D3MF::D3MFOpcPackage::validate(&DStack_58);
        D3MF::D3MFOpcPackage::~D3MFOpcPackage(&DStack_58);
      }
      else {
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar2;
}

Assistant:

bool D3MFImporter::CanRead(const std::string &filename, IOSystem *pIOHandler, bool checkSig) const {
    const std::string extension( GetExtension( filename ) );
    if(extension == desc.mFileExtensions ) {
        return true;
    } else if ( !extension.length() || checkSig ) {
        if ( nullptr == pIOHandler ) {
            return false;
        }
        if ( !ZipArchiveIOSystem::isZipArchive( pIOHandler, filename ) ) {
            return false;
        }
        D3MF::D3MFOpcPackage opcPackage( pIOHandler, filename );
        return opcPackage.validate();
    }

    return false;
}